

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O2

int av1_quantize_fp_no_qmatrix
              (int16_t *quant_ptr,int16_t *dequant_ptr,int16_t *round_ptr,int log_scale,
              int16_t *scan,int coeff_count,tran_low_t *coeff_ptr,tran_low_t *qcoeff_ptr,
              tran_low_t *dqcoeff_ptr)

{
  short sVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  int rounding [2];
  
  uVar7 = 0;
  memset(qcoeff_ptr,0,(long)coeff_count << 2);
  memset(dqcoeff_ptr,0,(long)coeff_count << 2);
  bVar4 = (byte)log_scale;
  iVar3 = (1 << (bVar4 & 0x1f)) >> 1;
  rounding[0] = *round_ptr + iVar3 >> (bVar4 & 0x1f);
  rounding[1] = round_ptr[1] + iVar3 >> (bVar4 & 0x1f);
  uVar6 = uVar7;
  do {
    while( true ) {
      if (coeff_count <= (int)uVar7) {
        return (int)uVar6;
      }
      lVar8 = (long)scan[uVar7];
      bVar11 = lVar8 != 0;
      iVar3 = coeff_ptr[lVar8];
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      sVar1 = dequant_ptr[bVar11];
      if ((long)sVar1 <= (long)iVar2 << (bVar4 + 1 & 0x3f)) break;
LAB_00184a6f:
      uVar7 = uVar7 + 1;
    }
    lVar5 = (long)rounding[bVar11] + (long)iVar2;
    if (0x7ffe < lVar5) {
      lVar5 = 0x7fff;
    }
    if (lVar5 < -0x7fff) {
      lVar5 = -0x8000;
    }
    lVar5 = quant_ptr[bVar11] * lVar5 >> (0x10 - bVar4 & 0x3f);
    if (lVar5 == 0) goto LAB_00184a6f;
    uVar9 = iVar3 >> 0x1f;
    uVar10 = (uint)lVar5;
    qcoeff_ptr[lVar8] = (uVar9 ^ uVar10) - uVar9;
    dqcoeff_ptr[lVar8] = ((int)((int)sVar1 * uVar10) >> (bVar4 & 0x1f) ^ uVar9) - uVar9;
    uVar7 = (ulong)((int)uVar7 + 1);
    uVar6 = uVar7;
  } while( true );
}

Assistant:

int av1_quantize_fp_no_qmatrix(const int16_t quant_ptr[2],
                               const int16_t dequant_ptr[2],
                               const int16_t round_ptr[2], int log_scale,
                               const int16_t *scan, int coeff_count,
                               const tran_low_t *coeff_ptr,
                               tran_low_t *qcoeff_ptr,
                               tran_low_t *dqcoeff_ptr) {
  memset(qcoeff_ptr, 0, coeff_count * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, coeff_count * sizeof(*dqcoeff_ptr));
  const int rounding[2] = { ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
                            ROUND_POWER_OF_TWO(round_ptr[1], log_scale) };
  int eob = 0;
  for (int i = 0; i < coeff_count; i++) {
    const int rc = scan[i];
    const int32_t thresh = (int32_t)(dequant_ptr[rc != 0]);
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32 = 0;
    if ((abs_coeff << (1 + log_scale)) >= thresh) {
      abs_coeff = clamp64(abs_coeff + rounding[rc != 0], INT16_MIN, INT16_MAX);
      tmp32 = (int)((abs_coeff * quant_ptr[rc != 0]) >> (16 - log_scale));
      if (tmp32) {
        qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
        const tran_low_t abs_dqcoeff =
            (tmp32 * dequant_ptr[rc != 0]) >> log_scale;
        dqcoeff_ptr[rc] = (abs_dqcoeff ^ coeff_sign) - coeff_sign;
      }
    }
    if (tmp32) eob = i + 1;
  }
  return eob;
}